

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 uv;
  ImU32 col_bot_right_local;
  ImU32 col_upr_right_local;
  ImU32 col_upr_left_local;
  ImVec2 *p_max_local;
  ImVec2 *p_min_local;
  ImDrawList *this_local;
  
  if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) & 0xff000000) != 0) {
    local_34 = this->_Data->TexUvWhitePixel;
    uv.x = (float)col_bot_right;
    uv.y = (float)col_upr_right;
    PrimReserve(this,6,4);
    PrimWriteIdx(this,(ImDrawIdx)this->_VtxCurrentIdx);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 1);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 2);
    PrimWriteIdx(this,(ImDrawIdx)this->_VtxCurrentIdx);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 2);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 3);
    PrimWriteVtx(this,p_min,&local_34,col_upr_left);
    ImVec2::ImVec2(&local_3c,p_max->x,p_min->y);
    PrimWriteVtx(this,&local_3c,&local_34,(ImU32)uv.y);
    PrimWriteVtx(this,p_max,&local_34,(ImU32)uv.x);
    ImVec2::ImVec2(&local_44,p_min->x,p_max->y);
    PrimWriteVtx(this,&local_44,&local_34,col_bot_left);
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& p_min, const ImVec2& p_max, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 3));
    PrimWriteVtx(p_min, uv, col_upr_left);
    PrimWriteVtx(ImVec2(p_max.x, p_min.y), uv, col_upr_right);
    PrimWriteVtx(p_max, uv, col_bot_right);
    PrimWriteVtx(ImVec2(p_min.x, p_max.y), uv, col_bot_left);
}